

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRShared.cpp
# Opt level: O0

void __thiscall Assimp::IrrlichtBase::ReadHexProperty(IrrlichtBase *this,HexProperty *out)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  allocator<char> local_41;
  string local_40 [36];
  uint local_1c;
  HexProperty *pHStack_18;
  int i;
  HexProperty *out_local;
  IrrlichtBase *this_local;
  
  pHStack_18 = out;
  out_local = (HexProperty *)this;
  for (local_1c = 0; uVar2 = local_1c, iVar1 = (*this->reader->_vptr_IIrrXMLReader[4])(),
      (int)uVar2 < iVar1; local_1c = local_1c + 1) {
    iVar1 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)local_1c);
    iVar1 = ASSIMP_stricmp((char *)CONCAT44(extraout_var,iVar1),"name");
    if (iVar1 == 0) {
      iVar1 = (*this->reader->_vptr_IIrrXMLReader[6])(this->reader,(ulong)local_1c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_40,(char *)CONCAT44(extraout_var_00,iVar1),&local_41);
      std::__cxx11::string::operator=((string *)pHStack_18,local_40);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator(&local_41);
    }
    else {
      iVar1 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)local_1c);
      iVar1 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_01,iVar1),"value");
      if (iVar1 == 0) {
        iVar1 = (*this->reader->_vptr_IIrrXMLReader[6])(this->reader,(ulong)local_1c);
        uVar2 = strtoul16((char *)CONCAT44(extraout_var_02,iVar1),(char **)0x0);
        pHStack_18->value = uVar2;
      }
    }
  }
  return;
}

Assistant:

void IrrlichtBase::ReadHexProperty    (HexProperty&    out)
{
    for (int i = 0; i < reader->getAttributeCount();++i)
    {
        if (!ASSIMP_stricmp(reader->getAttributeName(i),"name"))
        {
            out.name = std::string( reader->getAttributeValue(i) );
        }
        else if (!ASSIMP_stricmp(reader->getAttributeName(i),"value"))
        {
            // parse the hexadecimal value
            out.value = strtoul16(reader->getAttributeValue(i));
        }
    }
}